

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O2

void pzgeom::TPZQuadraticLine::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  TPZGeoNode *pTVar7;
  TPZGeoEl *pTVar8;
  long lVar9;
  int iVar10;
  int i_1;
  ulong uVar11;
  int64_t index;
  TPZVec<double> *local_120;
  TPZVec<double> *local_118;
  TPZManVector<double,_3> co;
  TPZManVector<double,_3> shift;
  TPZManVector<long,_3> nodeindexes;
  TPZManVector<double,_3> scale;
  
  TPZManVector<double,_3>::TPZManVector(&co,3);
  TPZManVector<double,_3>::TPZManVector(&shift,3);
  TPZManVector<double,_3>::TPZManVector(&scale,3);
  TPZManVector<long,_3>::TPZManVector(&nodeindexes,2);
  pdVar4 = size->fStore;
  pdVar5 = lowercorner->fStore;
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    scale.super_TPZVec<double>.fStore[lVar9] = pdVar4[lVar9] / 3.0;
    shift.super_TPZVec<double>.fStore[lVar9] = pdVar5[lVar9] + 0.5;
  }
  local_120 = lowercorner;
  local_118 = size;
  for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
    pztopology::TPZLine::ParametricDomainNodeCoord((int)lVar9,&co.super_TPZVec<double>);
    for (uVar11 = 0; (long)uVar11 < co.super_TPZVec<double>.fNElements; uVar11 = uVar11 + 1) {
      dVar1 = scale.super_TPZVec<double>.fStore[uVar11];
      dVar2 = co.super_TPZVec<double>.fStore[uVar11];
      dVar3 = shift.super_TPZVec<double>.fStore[uVar11];
      iVar6 = rand();
      co.super_TPZVec<double>.fStore[uVar11] =
           ((double)iVar6 * 0.2) / 2147483647.0 + dVar1 * dVar2 + dVar3 + -0.1;
    }
    TPZManVector<double,_3>::Resize(&co,3);
    for (; uVar11 < 3; uVar11 = uVar11 + 1) {
      dVar1 = shift.super_TPZVec<double>.fStore[uVar11];
      iVar6 = rand();
      co.super_TPZVec<double>.fStore[uVar11] = ((double)iVar6 * 0.2) / 2147483647.0 + dVar1 + -0.1;
    }
    iVar6 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    nodeindexes.super_TPZVec<long>.fStore[lVar9] = (long)iVar6;
    pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                       (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar6);
    TPZGeoNode::Initialize(pTVar7,&co.super_TPZVec<double>,gmesh);
  }
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,1,&nodeindexes,(ulong)(uint)matid,&index,1);
  pTVar8 = TPZGeoMesh::Element(gmesh,index);
  iVar6 = (**(code **)(*(long *)pTVar8 + 0xf0))(pTVar8);
  iVar10 = 0;
  if (iVar6 < 1) {
    iVar6 = iVar10;
  }
  for (; iVar6 != iVar10; iVar10 = iVar10 + 1) {
    (**(code **)(*(long *)pTVar8 + 0x180))(pTVar8,iVar10);
  }
  pTVar8 = TPZChangeEl::ChangeToQuadratic(gmesh,index);
  TPZGeoEl::NodePtr(pTVar8,2);
  pdVar4 = local_120->fStore;
  pdVar5 = local_118->fStore;
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    co.super_TPZVec<double>.fStore[lVar9] = pdVar5[lVar9] * 0.5 + pdVar4[lVar9];
  }
  pTVar7 = TPZGeoEl::NodePtr(pTVar8,2);
  TPZGeoNode::SetCoord(pTVar7,&co.super_TPZVec<double>);
  TPZManVector<long,_3>::~TPZManVector(&nodeindexes);
  TPZManVector<double,_3>::~TPZManVector(&scale);
  TPZManVector<double,_3>::~TPZManVector(&shift);
  TPZManVector<double,_3>::~TPZManVector(&co);
  return;
}

Assistant:

void TPZQuadraticLine::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    TPZManVector<REAL,3> co(3),shift(3),scale(3);
    TPZManVector<int64_t,3> nodeindexes(2);
    for (int i=0; i<3; i++) {
        scale[i] = size[i]/3.;
        shift[i] = 1./2.+lowercorner[i];
    }
    
    for (int i=0; i<NCornerNodes; i++) {
        ParametricDomainNodeCoord(i, co);
        int j;
        for (j=0; j<co.size(); j++) {
            co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        co.Resize(3);
        for (; j<3; j++) {
            co[j] = shift[j]+(rand()*0.2/RAND_MAX)-0.1;
        }
        nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
        gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
    }
    int64_t index;
    gmesh.CreateGeoElement(EOned, nodeindexes, matid, index);
    TPZGeoEl *gel = gmesh.Element(index);
    int nsides = gel->NSides();
    for (int is = 0; is<nsides; is++) {
        gel->SetSideDefined(is);
    }
    
    gel = TPZChangeEl::ChangeToQuadratic(&gmesh,index);
    TPZGeoNode *nodeptr = gel->NodePtr(2);
    for (int i=0; i<3; i++) {
        co[i] = lowercorner[i]+size[i]/2.;
    }
    gel->NodePtr(2)->SetCoord(co);
}